

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O3

LogicalExpr __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_testing::NiceMock<MockNLHandler>_>
::ReadLogicalExpr(NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_testing::NiceMock<MockNLHandler>_>
                  *this,int opcode)

{
  Kind KVar1;
  uint uVar2;
  int iVar3;
  AssertionFailure *this_00;
  char *pcVar4;
  MockNLHandler *this_01;
  BinaryReader<mp::internal::EndiannessConverter> *pBVar5;
  undefined8 local_38;
  undefined8 uStack_30;
  ArgList local_28;
  
  local_28.field_1.values_ = (Value *)&local_38;
  if (0x52 < (uint)opcode) {
    this_00 = (AssertionFailure *)__cxa_allocate_exception(0x10);
    AssertionFailure::AssertionFailure(this_00,"invalid opcode");
LAB_001c6cbb:
    __cxa_throw(this_00,&AssertionFailure::typeinfo,std::logic_error::~logic_error);
  }
  KVar1 = OpCodeInfo::INFO[(uint)opcode].first_kind;
  if ((int)KVar1 < 0x3b) {
    if (KVar1 == NOT) {
      this_01 = &this->handler_->super_MockNLHandler;
      ReadLogicalExpr(this);
      pcVar4 = "logical not";
    }
    else if (KVar1 == FIRST_BINARY_LOGICAL) {
      ReadLogicalExpr(this);
      ReadLogicalExpr(this);
      this_01 = &this->handler_->super_MockNLHandler;
      pcVar4 = "binary logical expression";
    }
    else {
      if (KVar1 != FIRST_RELATIONAL) goto switchD_001c6acf_caseD_3c;
      pBVar5 = this->reader_;
      pcVar4 = (pBVar5->super_BinaryReaderBase).super_ReaderBase.ptr_;
      (pBVar5->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar4;
      (pBVar5->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar4 + 1;
      ReadNumericExpr(this,*pcVar4,false);
      pBVar5 = this->reader_;
      pcVar4 = (pBVar5->super_BinaryReaderBase).super_ReaderBase.ptr_;
      (pBVar5->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar4;
      (pBVar5->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar4 + 1;
      ReadNumericExpr(this,*pcVar4,false);
      this_01 = &this->handler_->super_MockNLHandler;
      pcVar4 = "relational expression";
    }
  }
  else {
    switch(KVar1) {
    case ATLEAST:
      pBVar5 = this->reader_;
      pcVar4 = (pBVar5->super_BinaryReaderBase).super_ReaderBase.ptr_;
      (pBVar5->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar4;
      (pBVar5->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar4 + 1;
      ReadNumericExpr(this,*pcVar4,false);
      pBVar5 = this->reader_;
      pcVar4 = (pBVar5->super_BinaryReaderBase).super_ReaderBase.ptr_;
      (pBVar5->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar4;
      (pBVar5->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar4 + 1;
      if (*pcVar4 == 'o') {
        uVar2 = ReadOpCode(this);
        if (0x52 < uVar2) {
          this_00 = (AssertionFailure *)__cxa_allocate_exception(0x10);
          AssertionFailure::AssertionFailure(this_00,"invalid opcode");
          goto LAB_001c6cbb;
        }
        if (OpCodeInfo::INFO[uVar2].kind == COUNT) {
          this_01 = &this->handler_->super_MockNLHandler;
          ReadCountExpr(this);
          pcVar4 = "logical count expression";
          break;
        }
        pBVar5 = this->reader_;
      }
      local_38 = 0;
      uStack_30 = 0;
      local_28.types_ = 0;
      local_28.field_1.values_ = (Value *)&local_38;
      BinaryReaderBase::ReportError(&pBVar5->super_BinaryReaderBase,(CStringRef)0x261792,&local_28);
    default:
switchD_001c6acf_caseD_3c:
      local_38 = 0;
      uStack_30 = 0;
      local_28.types_ = 0;
      BinaryReaderBase::ReportError
                (&this->reader_->super_BinaryReaderBase,(CStringRef)0x2631f2,&local_28);
    case IMPLICATION:
      ReadLogicalExpr(this);
      ReadLogicalExpr(this);
      ReadLogicalExpr(this);
      this_01 = &this->handler_->super_MockNLHandler;
      pcVar4 = "implication expression";
      break;
    case EXISTS:
      iVar3 = ReadNumArgs(this,3);
      MockNLHandler::OnUnhandled(&this->handler_->super_MockNLHandler,"iterated logical expression")
      ;
      if (0 < iVar3) {
        do {
          ReadLogicalExpr(this);
          iVar3 = iVar3 + -1;
        } while (iVar3 != 0);
      }
      this_01 = &this->handler_->super_MockNLHandler;
      pcVar4 = "iterated logical expression";
      break;
    case ALLDIFF:
      iVar3 = ReadNumArgs(this,1);
      MockNLHandler::OnUnhandled(&this->handler_->super_MockNLHandler,"pairwise expression");
      if (0 < iVar3) {
        do {
          pBVar5 = this->reader_;
          pcVar4 = (pBVar5->super_BinaryReaderBase).super_ReaderBase.ptr_;
          (pBVar5->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar4;
          (pBVar5->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar4 + 1;
          ReadNumericExpr(this,*pcVar4,false);
          iVar3 = iVar3 + -1;
        } while (iVar3 != 0);
      }
      this_01 = &this->handler_->super_MockNLHandler;
      pcVar4 = "pairwise expression";
    }
  }
  MockNLHandler::OnUnhandled(this_01,pcVar4);
  return (LogicalExpr)NULL_ID;
}

Assistant:

fmt::StringRef ReadString() {
    int length = ReadUInt();
    return fmt::StringRef(length != 0 ? Read(length) : 0, length);
  }